

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_util.c
# Opt level: O0

int test_kvtree_util_set_get_bytecount(void)

{
  int iVar1;
  long local_30;
  kvtree *kvtree;
  unsigned_long roundtrip;
  unsigned_long value;
  char *key;
  int rc;
  
  key._4_4_ = 0;
  value = (unsigned_long)anon_var_dwarf_598;
  roundtrip = 0x11;
  kvtree = (kvtree *)0x0;
  local_30 = kvtree_new();
  if (local_30 == 0) {
    key._4_4_ = 1;
  }
  iVar1 = kvtree_util_set_bytecount(local_30,value,roundtrip);
  if (iVar1 != 0) {
    key._4_4_ = 1;
  }
  iVar1 = kvtree_util_get_bytecount(local_30,value,&kvtree);
  if (iVar1 != 0) {
    key._4_4_ = 1;
  }
  if (kvtree != (kvtree *)roundtrip) {
    key._4_4_ = 1;
  }
  kvtree_delete(&local_30);
  return key._4_4_;
}

Assistant:

int test_kvtree_util_set_get_bytecount(){
  int rc = TEST_PASS;
  char* key = "KEY";
  unsigned long value = 17;
  unsigned long roundtrip = 0;

  kvtree* kvtree = kvtree_new();

  if(kvtree == NULL) rc = TEST_FAIL;
  if(kvtree_util_set_bytecount(kvtree, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(kvtree_util_get_bytecount(kvtree, key, &roundtrip) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(roundtrip != value) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  return rc;
}